

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logistic_dist.hpp
# Opt level: O0

result_type_conflict1 __thiscall
trng::logistic_dist<float>::operator()(logistic_dist<float> *this,lcg64_shift *r)

{
  undefined8 in_RDI;
  result_type_conflict1 rVar1;
  logistic_dist<float> *unaff_retaddr;
  
  rVar1 = (result_type_conflict1)((ulong)in_RDI >> 0x20);
  utility::uniformoo<float,trng::lcg64_shift>((lcg64_shift *)0x31a271);
  rVar1 = icdf_(unaff_retaddr,rVar1);
  return rVar1;
}

Assistant:

TRNG_CUDA_ENABLE result_type operator()(R &r) {
      return icdf_(utility::uniformoo<result_type>(r));
    }